

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsChrpathUsed(cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmValue cVar4;
  string ll;
  string sepVar;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  TVar3 = GetType(this);
  if ((((TVar3 != SHARED_LIBRARY) && (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) &&
      (TVar3 = GetType(this), TVar3 != EXECUTABLE)) ||
     (bVar2 = cmTarget::GetHaveInstallRule(this->Target), !bVar2)) {
    return false;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_SKIP_RPATH",(allocator<char> *)&local_60);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar2) {
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&local_60);
  bVar2 = GetPropertyAsBool(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar2) {
    return false;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_NO_BUILTIN_CHRPATH",(allocator<char> *)&local_60);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar2) {
    return false;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator<char> *)&local_60);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar2) {
    return true;
  }
  GetLinkerLanguage(&local_80,this,config);
  if (local_80._M_string_length != 0) {
    cmStrCat<char_const(&)[30],std::__cxx11::string&,char_const(&)[10]>
              (&local_60,(char (*) [30])"CMAKE_SHARED_LIBRARY_RUNTIME_",&local_80,
               (char (*) [10])0x7ddc4b);
    cVar4 = cmMakefile::GetDefinition(this->Makefile,&local_60);
    if ((cVar4.Value != (string *)0x0) && ((cVar4.Value)->_M_string_length != 0)) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"CMAKE_EXECUTABLE_FORMAT",&local_81);
      cVar4 = cmMakefile::GetDefinition(pcVar1,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if ((cVar4.Value != (string *)0x0) && (bVar2 = std::operator==(cVar4.Value,"ELF"), bVar2)) {
        std::__cxx11::string::~string((string *)&local_60);
        bVar2 = true;
        goto LAB_004ec6b2;
      }
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  bVar2 = false;
LAB_004ec6b2:
  std::__cxx11::string::~string((string *)&local_80);
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::IsChrpathUsed(const std::string& config) const
{
  // Only certain target types have an rpath.
  if (!(this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->GetType() == cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // If the target will not be installed we do not need to change its
  // rpath.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // Skip chrpath if skipping rpath altogether.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // Skip chrpath if it does not need to be changed at install time.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // Allow the user to disable builtin chrpath explicitly.
  if (this->Makefile->IsOn("CMAKE_NO_BUILTIN_CHRPATH")) {
    return false;
  }

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return true;
  }

  // Enable if the rpath flag uses a separator and the target uses
  // binaries we know how to edit.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string sepVar =
      cmStrCat("CMAKE_SHARED_LIBRARY_RUNTIME_", ll, "_FLAG_SEP");
    cmValue sep = this->Makefile->GetDefinition(sepVar);
    if (cmNonempty(sep)) {
      // TODO: Add binary format check to ABI detection and get rid of
      // CMAKE_EXECUTABLE_FORMAT.
      if (cmValue fmt =
            this->Makefile->GetDefinition("CMAKE_EXECUTABLE_FORMAT")) {
        if (*fmt == "ELF") {
          return true;
        }
#if defined(CMake_USE_XCOFF_PARSER)
        if (*fmt == "XCOFF") {
          return true;
        }
#endif
      }
    }
  }
  return false;
}